

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

void __thiscall DPlayerMenu::SkinChanged(DPlayerMenu *this,FListMenuItem *li)

{
  uint uVar1;
  int iVar2;
  AActor *pAVar3;
  uint *puVar4;
  bool bVar5;
  FName local_24;
  uint local_20;
  TFlags<ActorFlag4,_unsigned_int> local_1c;
  int sel;
  FListMenuItem *li_local;
  DPlayerMenu *this_local;
  
  _sel = li;
  li_local = (FListMenuItem *)this;
  pAVar3 = GetDefaultByType((PClass *)this->PlayerClass->Type);
  TFlags<ActorFlag4,_unsigned_int>::operator&
            (&local_1c,
             (int)pAVar3 + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_FIXMAPTHINGPOS|MF4_BOSSDEATH));
  uVar1 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
  bVar5 = true;
  if (uVar1 == 0) {
    iVar2 = userinfo_t::GetPlayerClassNum((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8));
    bVar5 = iVar2 == -1;
  }
  if ((!bVar5) && (uVar1 = (*_sel->_vptr_FListMenuItem[0xb])(_sel,0,&local_20), (uVar1 & 1) != 0)) {
    puVar4 = (uint *)TArray<int,_int>::operator[](&this->PlayerSkins,(long)(int)local_20);
    local_20 = *puVar4;
    userinfo_t::SkinNumChanged((userinfo_t *)((long)consoleplayer * 0x2a0 + 0x1ae70f8),local_20);
    UpdateTranslation(this);
    cvar_set("skin",skins[(int)local_20].name);
    FName::FName(&local_24,NAME_Playerdisplay);
    _sel = DListMenu::GetItem(&this->super_DListMenu,&local_24);
    if (_sel != (FListMenuItem *)0x0) {
      (*_sel->_vptr_FListMenuItem[10])(_sel,0x10002,(ulong)local_20);
    }
  }
  return;
}

Assistant:

void DPlayerMenu::SkinChanged (FListMenuItem *li)
{
	if (GetDefaultByType (PlayerClass->Type)->flags4 & MF4_NOSKIN ||
		players[consoleplayer].userinfo.GetPlayerClassNum() == -1)
	{
		return;
	}

	int	sel;

	if (li->GetValue(0, &sel))
	{
		sel = PlayerSkins[sel];
		players[consoleplayer].userinfo.SkinNumChanged(sel);
		UpdateTranslation();
		cvar_set ("skin", skins[sel].name);

		li = GetItem(NAME_Playerdisplay);
		if (li != NULL)
		{
			li->SetValue(FListMenuItemPlayerDisplay::PDF_SKIN, sel);
		}
	}
}